

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJSONHelpers.cxx
# Opt level: O0

bool anon_unknown.dwarf_72e95::testRequired(void)

{
  bool bVar1;
  ErrorCode EVar2;
  ostream *poVar3;
  Value local_a0;
  undefined4 local_74;
  int local_70 [2];
  int i;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string str;
  Value v;
  
  Json::Value::Value((Value *)((long)&str.field_2 + 8),"Hello");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_58,"default",&local_59);
  std::allocator<char>::~allocator(&local_59);
  local_70[0] = 1;
  EVar2 = std::
          function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
          ::operator()((function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                        *)(anonymous_namespace)::RequiredStringHelper_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,(Value *)((long)&str.field_2 + 8));
  if (EVar2 == Success) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_58,"Hello");
    if (bVar1) {
      EVar2 = std::function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>::
              operator()((function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)> *)
                         (anonymous_namespace)::RequiredIntHelper,local_70,
                         (Value *)((long)&str.field_2 + 8));
      if (EVar2 == InvalidInt) {
        Json::Value::Value(&local_a0,2);
        Json::Value::operator=((Value *)((long)&str.field_2 + 8),&local_a0);
        Json::Value::~Value(&local_a0);
        std::__cxx11::string::operator=((string *)local_58,"default");
        local_70[0] = 1;
        EVar2 = std::
                function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                ::operator()((function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                              *)(anonymous_namespace)::RequiredStringHelper_abi_cxx11_,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_58,(Value *)((long)&str.field_2 + 8));
        if (EVar2 == InvalidString) {
          EVar2 = std::function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>::
                  operator()((function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>
                              *)(anonymous_namespace)::RequiredIntHelper,local_70,
                             (Value *)((long)&str.field_2 + 8));
          if (EVar2 == Success) {
            if (local_70[0] == 2) {
              std::__cxx11::string::operator=((string *)local_58,"default");
              local_70[0] = 1;
              EVar2 = std::
                      function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                      ::operator()((function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                                    *)(anonymous_namespace)::RequiredStringHelper_abi_cxx11_,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_58,(Value *)0x0);
              if (EVar2 == MissingRequired) {
                EVar2 = std::function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>
                        ::operator()((function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>
                                      *)(anonymous_namespace)::RequiredIntHelper,local_70,
                                     (Value *)0x0);
                if (EVar2 == MissingRequired) {
                  v.limit_._7_1_ = true;
                }
                else {
                  poVar3 = std::operator<<((ostream *)&std::cout,
                                           "ASSERT_TRUE(RequiredIntHelper(i, nullptr) == ErrorCode::MissingRequired) failed on line "
                                          );
                  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1c6);
                  std::operator<<(poVar3,"\n");
                  v.limit_._7_1_ = false;
                }
              }
              else {
                poVar3 = std::operator<<((ostream *)&std::cout,
                                         "ASSERT_TRUE(RequiredStringHelper(str, nullptr) == ErrorCode::MissingRequired) failed on line "
                                        );
                poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1c5);
                std::operator<<(poVar3,"\n");
                v.limit_._7_1_ = false;
              }
            }
            else {
              poVar3 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(i == 2) failed on line ");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1c0);
              std::operator<<(poVar3,"\n");
              v.limit_._7_1_ = false;
            }
          }
          else {
            poVar3 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(RequiredIntHelper(i, &v) == ErrorCode::Success) failed on line "
                                    );
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1bf);
            std::operator<<(poVar3,"\n");
            v.limit_._7_1_ = false;
          }
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(RequiredStringHelper(str, &v) == ErrorCode::InvalidString) failed on line "
                                  );
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1be);
          std::operator<<(poVar3,"\n");
          v.limit_._7_1_ = false;
        }
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(RequiredIntHelper(i, &v) == ErrorCode::InvalidInt) failed on line "
                                );
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1b9);
        std::operator<<(poVar3,"\n");
        v.limit_._7_1_ = false;
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(str == \"Hello\") failed on line "
                              );
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1b8);
      std::operator<<(poVar3,"\n");
      v.limit_._7_1_ = false;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(RequiredStringHelper(str, &v) == ErrorCode::Success) failed on line "
                            );
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1b7);
    std::operator<<(poVar3,"\n");
    v.limit_._7_1_ = false;
  }
  local_74 = 1;
  std::__cxx11::string::~string((string *)local_58);
  Json::Value::~Value((Value *)((long)&str.field_2 + 8));
  return v.limit_._7_1_;
}

Assistant:

bool testRequired()
{
  Json::Value v = "Hello";

  std::string str = "default";
  int i = 1;
  ASSERT_TRUE(RequiredStringHelper(str, &v) == ErrorCode::Success);
  ASSERT_TRUE(str == "Hello");
  ASSERT_TRUE(RequiredIntHelper(i, &v) == ErrorCode::InvalidInt);

  v = 2;
  str = "default";
  i = 1;
  ASSERT_TRUE(RequiredStringHelper(str, &v) == ErrorCode::InvalidString);
  ASSERT_TRUE(RequiredIntHelper(i, &v) == ErrorCode::Success);
  ASSERT_TRUE(i == 2);

  str = "default";
  i = 1;
  ASSERT_TRUE(RequiredStringHelper(str, nullptr) ==
              ErrorCode::MissingRequired);
  ASSERT_TRUE(RequiredIntHelper(i, nullptr) == ErrorCode::MissingRequired);

  return true;
}